

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::PrimitiveFieldGenerator::GenerateHashCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  char *text;
  LogFinisher local_51;
  LogMessage local_50;
  
  io::Printer::Print(printer,&this->variables_,"hash = (37 * hash) + $constant_name$;\n");
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
    text = "hash = (53 * hash) + get$capitalized_name$();\n";
    break;
  case JAVATYPE_LONG:
    text = "hash = (53 * hash) + hashLong(get$capitalized_name$());\n";
    break;
  case JAVATYPE_FLOAT:
    text = "hash = (53 * hash) + Float.floatToIntBits(\n    get$capitalized_name$());\n";
    break;
  case JAVATYPE_DOUBLE:
    text = 
    "hash = (53 * hash) + hashLong(\n    Double.doubleToLongBits(get$capitalized_name$()));\n";
    break;
  case JAVATYPE_BOOLEAN:
    text = "hash = (53 * hash) + hashBoolean(get$capitalized_name$());\n";
    break;
  case JAVATYPE_STRING:
  case JAVATYPE_BYTES:
    text = "hash = (53 * hash) + get$capitalized_name$().hashCode();\n";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_primitive_field.cc"
               ,0x1d3);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    return;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateHashCode(io::Printer* printer) const {
  printer->Print(variables_,
    "hash = (37 * hash) + $constant_name$;\n");
  switch (GetJavaType(descriptor_)) {
    case JAVATYPE_INT:
      printer->Print(variables_,
        "hash = (53 * hash) + get$capitalized_name$();\n");
      break;

    case JAVATYPE_LONG:
      printer->Print(variables_,
        "hash = (53 * hash) + hashLong(get$capitalized_name$());\n");
      break;

    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
        "hash = (53 * hash) + hashBoolean(get$capitalized_name$());\n");
      break;

    case JAVATYPE_FLOAT:
      printer->Print(variables_,
        "hash = (53 * hash) + Float.floatToIntBits(\n"
        "    get$capitalized_name$());\n");
      break;

    case JAVATYPE_DOUBLE:
      printer->Print(variables_,
        "hash = (53 * hash) + hashLong(\n"
        "    Double.doubleToLongBits(get$capitalized_name$()));\n");
      break;

    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
      printer->Print(variables_,
        "hash = (53 * hash) + get$capitalized_name$().hashCode();\n");
      break;

    case JAVATYPE_ENUM:
    case JAVATYPE_MESSAGE:
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      break;
  }
}